

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_name(PyObject *self,PyObject *args)

{
  int iVar1;
  long lVar2;
  PyObject *pPVar3;
  long lStack_20;
  PyObject *obj;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:name",&obj);
  if (iVar1 != 0) {
    if (obj == (PyObject *)&_Py_NoneStruct) {
      lVar2 = 0;
    }
    else {
      lVar2 = obj[1].ob_refcnt;
    }
    iVar1 = *(int *)(lVar2 + 8);
    if (iVar1 == 0x12) {
      lStack_20 = 0x18;
    }
    else {
      lStack_20 = 0x88;
      if ((iVar1 != 9) && (iVar1 != 0xd)) {
        lStack_20 = 0x10;
      }
    }
    pPVar3 = libxml_constxmlCharPtrWrap(*(xmlChar **)(lVar2 + lStack_20));
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_name(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    const xmlChar *res;

    if (!PyArg_ParseTuple(args, (char *) "O:name", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:{
                xmlDocPtr doc = (xmlDocPtr) cur;

                res = doc->URL;
                break;
            }
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = attr->name;
                break;
            }
        case XML_NAMESPACE_DECL:{
                xmlNsPtr ns = (xmlNsPtr) cur;

                res = ns->prefix;
                break;
            }
        default:
            res = cur->name;
            break;
    }
    resultobj = libxml_constxmlCharPtrWrap(res);

    return resultobj;
}